

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::ExportDnssecUsageByTable
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint32_t registry_id)

{
  uint32_t uVar1;
  uint local_34;
  uint local_30;
  uint32_t i;
  uint32_t nonusage_count;
  uint32_t usage_count;
  DnssecPrefixEntry *dpe;
  uint32_t registry_id_local;
  BinHash<DnssecPrefixEntry> *dnssecTable_local;
  DnsStats *this_local;
  
  i = 0;
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    uVar1 = BinHash<DnssecPrefixEntry>::GetSize(dnssecTable);
    if (uVar1 <= local_34) break;
    for (_nonusage_count = BinHash<DnssecPrefixEntry>::GetEntry(dnssecTable,local_34);
        _nonusage_count != (DnssecPrefixEntry *)0x0; _nonusage_count = _nonusage_count->HashNext) {
      if ((_nonusage_count->is_dnssec & 1U) == 0) {
        local_30 = local_30 + 1;
      }
      else {
        i = i + 1;
      }
    }
    local_34 = local_34 + 1;
  }
  SubmitRegistryNumberAndCount(this,registry_id,0,(ulong)local_30);
  SubmitRegistryNumberAndCount(this,registry_id,1,(ulong)i);
  return;
}

Assistant:

void DnsStats::ExportDnssecUsageByTable(BinHash<DnssecPrefixEntry>* dnssecTable, uint32_t registry_id)
{
    DnssecPrefixEntry *dpe;
    uint32_t usage_count = 0;
    uint32_t nonusage_count = 0;

    for (uint32_t i = 0; i < dnssecTable->GetSize(); i++)
    {
        dpe = dnssecTable->GetEntry(i);

        while (dpe != NULL)
        {
            if (dpe->is_dnssec) {
                usage_count++;
            } else {
                nonusage_count++;
            }
            dpe = dpe->HashNext;
        }
    }
    
    SubmitRegistryNumberAndCount(registry_id, 0, nonusage_count);
    SubmitRegistryNumberAndCount(registry_id, 1, usage_count);
}